

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.h
# Opt level: O1

string * __thiscall
bloaty::RangeMap::
EntryDebugString<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
          (string *__return_storage_ptr__,RangeMap *this,
          _Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> it)

{
  if (&(this->mappings_)._M_t._M_impl.super__Rb_tree_header == (_Rb_tree_header *)it._M_node) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[end]","");
  }
  else {
    EntryDebugString(__return_storage_ptr__,*(uint64_t *)(it._M_node + 1),
                     (uint64_t)it._M_node[2]._M_parent,(uint64_t)it._M_node[2]._M_left,
                     (string *)&it._M_node[1]._M_parent);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EntryDebugString(T it) const {
    if (it == mappings_.end()) {
      return "[end]";
    } else {
      return EntryDebugString(it->first, it->second.size,
                              it->second.other_start, it->second.label);
    }
  }